

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

void __thiscall QR_compute_Test::~QR_compute_Test(QR_compute_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(QR, compute) {
    Matrix<T, 3, 5> A;
    
    A <<
    8, 7, 1, 1,  4,
    8, 2, 3, 9, 10,
    4, 8, 1, 7,  1;
    
    Eigen::HouseholderQR<Matrix<T,5,3>> qr(A.transpose());
    
    auto R = qr.matrixQR();
    
    ASSERT_FLOAT_EQ(-11.445523142259598f, R(0,0));
    ASSERT_FLOAT_EQ(-11.358152736593492f, R(0,1));
    ASSERT_FLOAT_EQ(-8.737040566610379f, R(0,2));
    ASSERT_FLOAT_EQ(11.357480636664706f, R(1,1));
    ASSERT_FLOAT_EQ(2.180356680396514f, R(1,2));
    ASSERT_FLOAT_EQ(-7.064712795553326f, R(2,2));
}